

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O2

void test_intersects(void)

{
  _Bool _Var1;
  bitset_t *b1;
  bitset_t *b2;
  bitset_t *bitset;
  int i;
  ulong i_00;
  
  b1 = bitset_create();
  b2 = bitset_create();
  for (i_00 = 0; i_00 != 1000; i_00 = i_00 + 1) {
    bitset = b2;
    if ((i_00 & 1) == 0) {
      bitset = b1;
    }
    bitset_set(bitset,i_00);
  }
  _Var1 = bitsets_intersect(b1,b2);
  _assert_true((ulong)!_Var1,"!bitsets_intersect(evens, odds)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0xe8);
  bitset_set(b1,0x3e9);
  bitset_set(b2,0x3e9);
  _Var1 = bitsets_intersect(b1,b2);
  _assert_true((ulong)_Var1,"bitsets_intersect(evens, odds)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0xed);
  bitset_free(b1);
  bitset_free(b2);
  return;
}

Assistant:

DEFINE_TEST(test_intersects) {
    bitset_t *evens = bitset_create();
    bitset_t *odds = bitset_create();

    for (int i = 0; i < 1000; i++) {
        if (i % 2 == 0)
            bitset_set(evens, i);
        else
            bitset_set(odds, i);
    }

    assert_true(!bitsets_intersect(evens, odds));

    bitset_set(evens, 1001);
    bitset_set(odds, 1001);

    assert_true(bitsets_intersect(evens, odds));

    bitset_free(evens);
    bitset_free(odds);
}